

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnBrIfExpr(BinaryReaderIR *this,Index depth)

{
  Result RVar1;
  tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_> tVar2;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_90;
  Location local_88;
  Var local_60;
  
  local_88.field_1.field_0.line = 0;
  local_88.field_1._4_8_ = 0;
  local_88.filename.data_ = (char *)0x0;
  local_88.filename.size_._0_4_ = 0;
  local_88.filename.size_._4_4_ = 0;
  Var::Var(&local_60,depth,&local_88);
  tVar2.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)operator_new(0x88);
  *(long *)((long)tVar2.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar2.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)tVar2.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)tVar2.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)tVar2.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x24) = 0;
  *(undefined8 *)
   ((long)tVar2.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x2c) = 0;
  *(undefined4 *)
   ((long)tVar2.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x38) = 9;
  *(undefined ***)
   tVar2.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
   super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = &PTR__VarExpr_0019bf48;
  Var::Var((Var *)((long)tVar2.
                         super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                         super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40),&local_60);
  local_90._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       tVar2.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_90);
  if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
      local_90._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_90._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
  local_90._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)0x0;
  Var::~Var(&local_60);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnBrIfExpr(Index depth) {
  return AppendExpr(MakeUnique<BrIfExpr>(Var(depth)));
}